

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::PatchInitValueCheckLayout<Js::PolymorphicInlineCache>
               (FunctionBody *functionBody,PolymorphicInlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,RecyclableObject *object,PropertyId propertyId,
               Var newValue)

{
  bool bVar1;
  DynamicObject *pDVar2;
  DynamicTypeHandler *pDVar3;
  DynamicTypeHandler *pDVar4;
  
  bVar1 = VarIsImpl<Js::DynamicObject>(object);
  if (bVar1) {
    pDVar2 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(object);
    pDVar3 = DynamicObject::GetTypeHandler(pDVar2);
    PatchInitValue<true,Js::PolymorphicInlineCache>
              (functionBody,inlineCache,inlineCacheIndex,object,propertyId,newValue);
    if (pDVar3 != (DynamicTypeHandler *)0x0) {
      pDVar2 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(object);
      pDVar4 = DynamicObject::GetTypeHandler(pDVar2);
      if (pDVar4 != pDVar3) {
        if (pDVar3->inlineSlotCapacity != pDVar4->inlineSlotCapacity) {
          return true;
        }
        return pDVar3->offsetOfInlineSlots != pDVar4->offsetOfInlineSlots;
      }
    }
  }
  else {
    PatchInitValue<true,Js::PolymorphicInlineCache>
              (functionBody,inlineCache,inlineCacheIndex,object,propertyId,newValue);
  }
  return false;
}

Assistant:

inline bool JavascriptOperators::PatchInitValueCheckLayout(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, RecyclableObject* object, PropertyId propertyId, Var newValue)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchInitValueCheckLayout);
        JIT_HELPER_SAME_ATTRIBUTES(Op_PatchInitValueCheckLayout, Op_PatchInitValue);

        DynamicTypeHandler * oldTypeHandler = VarIs<DynamicObject>(object) ? UnsafeVarTo<DynamicObject>(object)->GetTypeHandler() : nullptr;
        PatchInitValue<true, TInlineCache>(functionBody, inlineCache, inlineCacheIndex, object, propertyId, newValue);
        return (oldTypeHandler != nullptr && LayoutChanged(UnsafeVarTo<DynamicObject>(object), oldTypeHandler));

        JIT_HELPER_END(Op_PatchInitValueCheckLayout);
    }